

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint64_t uVar69;
  uint64_t uVar70;
  uint64_t uVar71;
  int iVar72;
  uint uVar73;
  int iVar74;
  ulong uVar75;
  long lVar76;
  secp256k1_scalar *psVar77;
  long lVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  secp256k1_gej *r_00;
  long lVar84;
  secp256k1_ge *psVar85;
  secp256k1_strauss_point_state *psVar86;
  secp256k1_ge *psVar87;
  secp256k1_gej *psVar88;
  secp256k1_strauss_point_state *r_01;
  secp256k1_strauss_point_state *error_callback;
  secp256k1_ge *psVar89;
  uint64_t *puVar90;
  code *cb;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  secp256k1_scalar **cbdata;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  byte bVar102;
  ecmult_multi_data data;
  secp256k1_gej r;
  secp256k1_gej t1p;
  secp256k1_gej ptgj;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_gej expected;
  secp256k1_ge ptg;
  secp256k1_scalar tmp1;
  secp256k1_scalar tmp2;
  secp256k1_gej r2;
  secp256k1_fe aux [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_ge ptg_4;
  secp256k1_ge pt [32];
  size_t sStack_1bb0;
  secp256k1_scalar *local_1b98;
  secp256k1_ge *local_1b90;
  ulong local_1b88;
  ulong local_1b80;
  ulong local_1b78;
  ulong local_1b70;
  ulong local_1b68;
  ulong local_1b60;
  ulong local_1b58;
  ulong local_1b50;
  secp256k1_gej local_1b48;
  secp256k1_gej local_1ac8;
  secp256k1_gej local_1a48;
  secp256k1_scalar local_19c0;
  secp256k1_strauss_state local_19a0;
  secp256k1_scalar local_1988;
  secp256k1_gej local_1968;
  secp256k1_gej local_18e8;
  secp256k1_scalar local_1868;
  secp256k1_scalar local_1848;
  secp256k1_scalar local_1828;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  secp256k1_scalar local_1448;
  secp256k1_gej local_1428;
  secp256k1_fe local_13a8 [8];
  undefined1 local_1268 [120];
  int local_11f0;
  secp256k1_gej local_e58 [5];
  secp256k1_ge local_b90;
  secp256k1_ge local_b38;
  secp256k1_ge local_ae0 [31];
  
  bVar102 = 0;
  local_1b98 = &local_1848;
  cbdata = &local_1b98;
  local_1b90 = &local_b38;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar77 = (secp256k1_scalar *)0x0;
  psVar86 = (secp256k1_strauss_point_state *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                           (secp256k1_scalar *)0x0,ecmult_multi_callback,cbdata,0);
  if (iVar72 == 0) goto LAB_001672c9;
  if (0 < COUNT) {
    uVar75 = 0;
    do {
      local_1b88 = uVar75;
      random_scalar_order(&local_1848);
      random_scalar_order(&local_1828);
      random_group_element_test((secp256k1_ge *)&local_18e8);
      local_1a48.infinity = (int)local_18e8.z.n[0];
      local_1a48.x.n[4] = local_18e8.x.n[4];
      local_1a48.x.n[2] = local_18e8.x.n[2];
      local_1a48.x.n[3] = local_18e8.x.n[3];
      local_1a48.x.n[0] = local_18e8.x.n[0];
      local_1a48.x.n[1] = local_18e8.x.n[1];
      local_1a48.y.n[4] = local_18e8.y.n[4];
      local_1a48.y.n[2] = local_18e8.y.n[2];
      local_1a48.y.n[3] = local_18e8.y.n[3];
      local_1a48.y.n[0] = local_18e8.y.n[0];
      local_1a48.y.n[1] = local_18e8.y.n[1];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      psVar88 = &local_18e8;
      psVar85 = &local_b38;
      for (lVar76 = 0xb; lVar76 != 0; lVar76 = lVar76 + -1) {
        (psVar85->x).n[0] = (psVar88->x).n[0];
        psVar88 = (secp256k1_gej *)((long)psVar88 + (ulong)bVar102 * -0x10 + 8);
        psVar85 = (secp256k1_ge *)((long)psVar85 + ((ulong)bVar102 * -2 + 1) * 8);
      }
      psVar85 = &secp256k1_ge_const_g;
      psVar87 = local_ae0;
      for (lVar76 = 0xb; lVar76 != 0; lVar76 = lVar76 + -1) {
        (psVar87->x).n[0] = (psVar85->x).n[0];
        psVar85 = (secp256k1_ge *)((long)psVar85 + ((ulong)bVar102 * -2 + 1) * 8);
        psVar87 = (secp256k1_ge *)((long)psVar87 + ((ulong)bVar102 * -2 + 1) * 8);
      }
      psVar77 = &local_1848;
      local_1ac8.x.n[2] = (uint64_t)local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,
                 &secp256k1_scalar_zero,psVar77);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b98;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,psVar77,
                               ecmult_multi_callback,&local_1b98,0);
      if (iVar72 == 0) goto LAB_0016727e;
      secp256k1_gej_neg((secp256k1_gej *)local_1268,&local_1b48);
      psVar77 = (secp256k1_scalar *)0x0;
      psVar86 = (secp256k1_strauss_point_state *)local_1268;
      error_callback = (secp256k1_strauss_point_state *)local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)local_1268,(secp256k1_gej *)local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_11f0 == 0) goto LAB_00167283;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      local_1ac8.x.n[2] = (uint64_t)local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,&local_1848,
                 &secp256k1_scalar_zero);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b98;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                               &secp256k1_scalar_zero,ecmult_multi_callback,&local_1b98,1);
      if (iVar72 == 0) goto LAB_00167288;
      secp256k1_gej_neg((secp256k1_gej *)local_1268,&local_1b48);
      psVar77 = (secp256k1_scalar *)0x0;
      psVar86 = (secp256k1_strauss_point_state *)local_1268;
      error_callback = (secp256k1_strauss_point_state *)local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)local_1268,(secp256k1_gej *)local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_11f0 == 0) goto LAB_0016728d;
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_false_callback;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b98;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                               &secp256k1_scalar_zero,ecmult_multi_false_callback,&local_1b98,1);
      if (iVar72 != 0) goto LAB_00167292;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      local_1ac8.x.n[2] = (uint64_t)local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,&local_1848,
                 &local_1828);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b98;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                               &secp256k1_scalar_zero,ecmult_multi_callback,&local_1b98,2);
      if (iVar72 == 0) goto LAB_00167297;
      secp256k1_gej_neg((secp256k1_gej *)local_1268,&local_1b48);
      psVar77 = (secp256k1_scalar *)0x0;
      psVar86 = (secp256k1_strauss_point_state *)local_1268;
      error_callback = (secp256k1_strauss_point_state *)local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)local_1268,(secp256k1_gej *)local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_11f0 == 0) goto LAB_0016729c;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      psVar77 = &local_1828;
      local_1ac8.x.n[2] = (uint64_t)local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,&local_1848,
                 psVar77);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b98;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,psVar77,
                               ecmult_multi_callback,&local_1b98,1);
      if (iVar72 == 0) goto LAB_001672a1;
      secp256k1_gej_neg((secp256k1_gej *)local_1268,&local_1b48);
      psVar77 = (secp256k1_scalar *)0x0;
      psVar86 = (secp256k1_strauss_point_state *)local_1268;
      error_callback = (secp256k1_strauss_point_state *)local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)local_1268,(secp256k1_gej *)local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_11f0 == 0) goto LAB_001672a6;
      uVar73 = (int)local_1b88 + 1;
      uVar75 = (ulong)uVar73;
    } while ((int)uVar73 < COUNT);
  }
  if (0 < COUNT) {
    uVar75 = 0;
    do {
      lVar76 = 0;
      local_1b88 = uVar75;
      do {
        lVar84 = 0x50;
        psVar77 = &local_1848;
        do {
          random_scalar_order(psVar77);
          *(undefined4 *)((long)local_b38.x.n + lVar84) = 1;
          *(undefined8 *)((long)local_b90.x.n + lVar84 + 8) = 0;
          *(undefined8 *)((long)local_b90.x.n + lVar84 + 0x10) = 0;
          *(undefined8 *)((long)local_b90.x.n + lVar84 + 0x18) = 0;
          *(undefined8 *)((long)local_b90.x.n + lVar84 + 0x20) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar84) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar84 + 8) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar84 + 0x10) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar84 + 0x18) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar84 + 0x20) = 0;
          *(undefined8 *)((long)(&local_b90.y + 1) + lVar84) = 0;
          lVar84 = lVar84 + 0x58;
          psVar77 = psVar77 + 1;
        } while (lVar84 != 0xb50);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar77 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b98;
        psVar86 = (secp256k1_strauss_point_state *)scratch;
        iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                 &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,
                                 (&DAT_00183c80)[lVar76]);
        if (iVar72 == 0) goto LAB_00167256;
        if (local_1b48.infinity == 0) goto LAB_0016725b;
        lVar76 = lVar76 + 1;
      } while (lVar76 != 3);
      lVar76 = 0;
      do {
        psVar85 = &local_b38;
        lVar84 = 0;
        do {
          random_group_element_test((secp256k1_ge *)local_1268);
          psVar87 = (secp256k1_ge *)local_1268;
          psVar89 = psVar85;
          for (lVar78 = 0xb; lVar78 != 0; lVar78 = lVar78 + -1) {
            (psVar89->x).n[0] = (psVar87->x).n[0];
            psVar87 = (secp256k1_ge *)((long)psVar87 + (ulong)bVar102 * -0x10 + 8);
            psVar89 = (secp256k1_ge *)((long)psVar89 + ((ulong)bVar102 * -2 + 1) * 8);
          }
          *(undefined8 *)((long)local_1848.d + lVar84 + 0x10) = 0;
          *(undefined8 *)((long)local_1848.d + lVar84 + 0x18) = 0;
          *(undefined8 *)((long)local_1848.d + lVar84) = 0;
          *(undefined8 *)((long)local_1848.d + lVar84 + 8) = 0;
          lVar84 = lVar84 + 0x20;
          psVar85 = psVar85 + 1;
        } while (lVar84 != 0x400);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar77 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b98;
        psVar86 = (secp256k1_strauss_point_state *)scratch;
        iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                 &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,
                                 (&DAT_00183c80)[lVar76]);
        if (iVar72 == 0) goto LAB_00167260;
        if (local_1b48.infinity == 0) goto LAB_00167265;
        lVar76 = lVar76 + 1;
      } while (lVar76 != 3);
      lVar76 = 0;
      do {
        random_group_element_test((secp256k1_ge *)local_1268);
        lVar84 = 0x58;
        psVar77 = &local_1848;
        do {
          random_scalar_order(psVar77);
          secp256k1_scalar_negate(psVar77 + 1,psVar77);
          psVar85 = (secp256k1_ge *)local_1268;
          puVar90 = (uint64_t *)((long)local_b90.x.n + lVar84);
          for (lVar78 = 0xb; lVar78 != 0; lVar78 = lVar78 + -1) {
            *puVar90 = (psVar85->x).n[0];
            psVar85 = (secp256k1_ge *)((long)psVar85 + (ulong)bVar102 * -0x10 + 8);
            puVar90 = puVar90 + (ulong)bVar102 * -2 + 1;
          }
          psVar85 = (secp256k1_ge *)local_1268;
          puVar90 = (uint64_t *)((long)local_b38.x.n + lVar84);
          for (lVar78 = 0xb; lVar78 != 0; lVar78 = lVar78 + -1) {
            *puVar90 = (psVar85->x).n[0];
            psVar85 = (secp256k1_ge *)((long)psVar85 + (ulong)bVar102 * -0x10 + 8);
            puVar90 = puVar90 + (ulong)bVar102 * -2 + 1;
          }
          lVar84 = lVar84 + 0xb0;
          psVar77 = psVar77 + 2;
        } while (lVar84 != 0xb58);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        sVar1 = (&DAT_00183c80)[lVar76];
        psVar77 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b98;
        psVar86 = (secp256k1_strauss_point_state *)scratch;
        iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                 &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,sVar1);
        if (iVar72 == 0) goto LAB_0016726a;
        if (local_1b48.infinity == 0) goto LAB_0016726f;
        random_scalar_order(&local_1848);
        lVar84 = 0x20;
        psVar85 = &local_b38;
        do {
          random_group_element_test((secp256k1_ge *)local_1268);
          uVar70 = local_1848.d[3];
          uVar69 = local_1848.d[1];
          *(uint64_t *)((long)local_1868.d + lVar84 + 0x10) = local_1848.d[2];
          *(uint64_t *)((long)local_1868.d + lVar84 + 0x18) = uVar70;
          *(uint64_t *)((long)local_1868.d + lVar84) = local_1848.d[0];
          *(uint64_t *)((long)local_1868.d + lVar84 + 8) = uVar69;
          *(uint64_t *)((long)local_1848.d + lVar84) = local_1848.d[0];
          *(uint64_t *)((long)local_1848.d + lVar84 + 8) = local_1848.d[1];
          *(uint64_t *)((long)local_1848.d + lVar84 + 0x10) = local_1848.d[2];
          *(uint64_t *)((long)local_1848.d + lVar84 + 0x18) = local_1848.d[3];
          psVar87 = (secp256k1_ge *)local_1268;
          psVar89 = psVar85;
          for (lVar78 = 0xb; lVar78 != 0; lVar78 = lVar78 + -1) {
            (psVar89->x).n[0] = (psVar87->x).n[0];
            psVar87 = (secp256k1_ge *)((long)psVar87 + (ulong)bVar102 * -0x10 + 8);
            psVar89 = (secp256k1_ge *)((long)psVar89 + (ulong)bVar102 * -0x10 + 8);
          }
          secp256k1_ge_neg(psVar85 + 1,psVar85);
          lVar84 = lVar84 + 0x40;
          psVar85 = psVar85 + 2;
        } while (lVar84 != 0x420);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar77 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b98;
        psVar86 = (secp256k1_strauss_point_state *)scratch;
        iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                 &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,sVar1);
        if (iVar72 == 0) goto LAB_00167274;
        if (local_1b48.infinity == 0) goto LAB_00167279;
        lVar76 = lVar76 + 1;
      } while (lVar76 != 3);
      random_group_element_test((secp256k1_ge *)local_1268);
      local_1848.d[2] = 0;
      local_1848.d[3] = 0;
      local_1848.d[0] = 0;
      local_1848.d[1] = 0;
      psVar85 = (secp256k1_ge *)local_1268;
      psVar87 = &local_b38;
      for (lVar76 = 0xb; lVar76 != 0; lVar76 = lVar76 + -1) {
        (psVar87->x).n[0] = (psVar85->x).n[0];
        psVar85 = (secp256k1_ge *)((long)psVar85 + (ulong)bVar102 * -0x10 + 8);
        psVar87 = (secp256k1_ge *)((long)psVar87 + ((ulong)bVar102 * -2 + 1) * 8);
      }
      lVar76 = 0x58;
      psVar77 = &local_1828;
      do {
        psVar85 = (secp256k1_ge *)local_1268;
        puVar90 = (uint64_t *)((long)local_b38.x.n + lVar76);
        for (lVar84 = 0xb; lVar84 != 0; lVar84 = lVar84 + -1) {
          *puVar90 = (psVar85->x).n[0];
          psVar85 = (secp256k1_ge *)((long)psVar85 + (ulong)bVar102 * -0x10 + 8);
          puVar90 = puVar90 + (ulong)bVar102 * -2 + 1;
        }
        random_scalar_order(psVar77);
        secp256k1_scalar_add(&local_1848,&local_1848,psVar77);
        secp256k1_scalar_negate(psVar77,psVar77);
        lVar76 = lVar76 + 0x58;
        psVar77 = psVar77 + 1;
      } while (lVar76 != 0xb00);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1b98;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                               &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x20);
      if (iVar72 == 0) goto LAB_001672bf;
      if (local_1b48.infinity == 0) goto LAB_001672c4;
      uVar73 = (int)local_1b88 + 1;
      uVar75 = (ulong)uVar73;
    } while ((int)uVar73 < COUNT);
  }
  if (0 < COUNT) {
    iVar72 = 0;
    do {
      local_1b48.infinity = 1;
      local_1b48.x.n[0] = 0;
      local_1b48.x.n[1] = 0;
      local_1b48.x.n[2] = 0;
      local_1b48.x.n[3] = 0;
      local_1b48.x.n[4] = 0;
      local_1b48.y.n[0] = 0;
      local_1b48.y.n[1] = 0;
      local_1b48.y.n[2] = 0;
      local_1b48.y.n[3] = 0;
      local_1b48.y.n[4] = 0;
      local_1b48.z.n[0] = 0;
      local_1b48.z.n[1] = 0;
      local_1b48.z.n[2] = 0;
      local_1b48.z.n[3] = 0;
      local_1b48.z.n[4] = 0;
      random_scalar_order(&local_1848);
      psVar85 = &local_b38;
      lVar76 = 0;
      do {
        uVar71 = local_1848.d[3];
        uVar70 = local_1848.d[2];
        uVar69 = local_1848.d[1];
        *(uint64_t *)((long)local_1848.d + lVar76) = local_1848.d[0];
        *(uint64_t *)((long)local_1848.d + lVar76 + 8) = uVar69;
        *(uint64_t *)((long)local_1848.d + lVar76 + 0x10) = uVar70;
        *(uint64_t *)((long)local_1848.d + lVar76 + 0x18) = uVar71;
        random_group_element_test((secp256k1_ge *)local_1268);
        psVar86 = (secp256k1_strauss_point_state *)local_1268;
        psVar87 = psVar85;
        for (lVar84 = 0xb; lVar84 != 0; lVar84 = lVar84 + -1) {
          (psVar87->x).n[0] = ((secp256k1_fe *)psVar86->wnaf_na_1)->n[0];
          psVar86 = (secp256k1_strauss_point_state *)((long)psVar86 + (ulong)bVar102 * -0x10 + 8);
          psVar87 = (secp256k1_ge *)((long)psVar87 + (ulong)bVar102 * -0x10 + 8);
        }
        secp256k1_gej_add_ge_var(&local_1b48,&local_1b48,psVar85,(secp256k1_fe *)0x0);
        lVar76 = lVar76 + 0x20;
        psVar85 = psVar85 + 1;
      } while (lVar76 != 0x280);
      local_1a48.x.n[0] = (uint64_t)local_13a8;
      local_1a48.x.n[1] = (uint64_t)local_e58;
      local_1a48.x.n[2] = (uint64_t)local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1a48,&local_1428,1,&local_1b48,&local_1848,
                 &secp256k1_scalar_zero);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1b98;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      iVar74 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                               &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
      if (iVar74 == 0) goto LAB_001672ab;
      secp256k1_gej_neg((secp256k1_gej *)local_1268,&local_1b48);
      psVar77 = (secp256k1_scalar *)0x0;
      psVar86 = (secp256k1_strauss_point_state *)local_1268;
      error_callback = (secp256k1_strauss_point_state *)local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)local_1268,(secp256k1_gej *)local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_11f0 == 0) goto LAB_001672b0;
      iVar72 = iVar72 + 1;
    } while (iVar72 < COUNT);
  }
  if (0 < COUNT) {
    iVar72 = 0;
    do {
      local_1ac8.x.n[2] = 0;
      local_1ac8.x.n[3] = 0;
      local_1ac8.x.n[0] = 0;
      local_1ac8.x.n[1] = 0;
      random_group_element_test((secp256k1_ge *)&local_18e8);
      psVar77 = &local_1848;
      lVar76 = 0;
      do {
        random_scalar_order(psVar77);
        psVar88 = &local_18e8;
        puVar90 = (uint64_t *)((long)local_b38.x.n + lVar76);
        for (lVar84 = 0xb; lVar84 != 0; lVar84 = lVar84 + -1) {
          *puVar90 = (psVar88->x).n[0];
          psVar88 = (secp256k1_gej *)((long)psVar88 + (ulong)bVar102 * -0x10 + 8);
          puVar90 = puVar90 + (ulong)bVar102 * -2 + 1;
        }
        secp256k1_scalar_add
                  ((secp256k1_scalar *)&local_1ac8,(secp256k1_scalar *)&local_1ac8,psVar77);
        lVar76 = lVar76 + 0x58;
        psVar77 = psVar77 + 1;
      } while (lVar76 != 0x6e0);
      local_1a48.infinity = local_b38.infinity;
      local_1a48.x.n[4] = local_b38.x.n[4];
      local_1a48.x.n[2] = local_b38.x.n[2];
      local_1a48.x.n[3] = local_b38.x.n[3];
      local_1a48.x.n[0] = local_b38.x.n[0];
      local_1a48.x.n[1] = local_b38.x.n[1];
      local_1a48.y.n[4] = local_b38.y.n[4];
      local_1a48.y.n[2] = local_b38.y.n[2];
      local_1a48.y.n[3] = local_b38.y.n[3];
      local_1a48.y.n[0] = local_b38.y.n[0];
      local_1a48.y.n[1] = local_b38.y.n[1];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      local_1968.x.n[0] = (uint64_t)local_13a8;
      local_1968.x.n[1] = (uint64_t)local_e58;
      local_1968.x.n[2] = (uint64_t)local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1968,&local_1428,1,&local_1a48,
                 (secp256k1_scalar *)&local_1ac8,&secp256k1_scalar_zero);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1b98;
      psVar86 = (secp256k1_strauss_point_state *)scratch;
      iVar74 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                               &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
      if (iVar74 == 0) goto LAB_001672b5;
      secp256k1_gej_neg((secp256k1_gej *)local_1268,&local_1b48);
      psVar77 = (secp256k1_scalar *)0x0;
      psVar86 = (secp256k1_strauss_point_state *)local_1268;
      error_callback = (secp256k1_strauss_point_state *)local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)local_1268,(secp256k1_gej *)local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_11f0 == 0) goto LAB_001672ba;
      iVar72 = iVar72 + 1;
    } while (iVar72 < COUNT);
  }
  lVar76 = 0;
  psVar85 = &local_b38;
  do {
    random_scalar_order((secp256k1_scalar *)((long)local_1848.d + lVar76));
    random_group_element_test(psVar85);
    psVar85 = psVar85 + 1;
    lVar76 = lVar76 + 0x20;
  } while (lVar76 != 0x280);
  local_1848.d[2] = 0;
  local_1848.d[3] = 0;
  local_1848.d[0] = 0;
  local_1848.d[1] = 0;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar77 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1b98;
  psVar86 = (secp256k1_strauss_point_state *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                           &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
  if (iVar72 == 0) goto LAB_001672ce;
  local_17b8 = 0;
  uStack_17b0 = 0;
  local_17c8 = 0;
  uStack_17c0 = 0;
  local_17d8 = 0;
  uStack_17d0 = 0;
  local_17e8 = 0;
  uStack_17e0 = 0;
  local_17f8 = 0;
  uStack_17f0 = 0;
  local_1808 = 0;
  uStack_1800 = 0;
  local_1828.d[2] = 0;
  local_1828.d[3] = 0;
  local_1828.d[0] = 0;
  local_1828.d[1] = 0;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar77 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1b98;
  psVar86 = (secp256k1_strauss_point_state *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                           &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,6);
  if (iVar72 == 0) goto LAB_001672d3;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar77 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1b98;
  psVar86 = (secp256k1_strauss_point_state *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                           &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,5);
  if (iVar72 != 0) {
    if (local_1b48.infinity != 0) {
      random_group_element_test(&local_b90);
      local_1a48.infinity = local_b90.infinity;
      local_1a48.x.n[0] = local_b90.x.n[0];
      local_1a48.x.n[1] = local_b90.x.n[1];
      local_1a48.x.n[2] = local_b90.x.n[2];
      local_1a48.x.n[3] = local_b90.x.n[3];
      local_1a48.x.n[4] = local_b90.x.n[4];
      local_1a48.y.n[0] = local_b90.y.n[0];
      local_1a48.y.n[1] = local_b90.y.n[1];
      local_1a48.y.n[2] = local_b90.y.n[2];
      local_1a48.y.n[3] = local_b90.y.n[3];
      local_1a48.y.n[4] = local_b90.y.n[4];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1b80 = 0;
      do {
        local_1b78 = local_1b80 + 1 >> 1;
        local_1b70 = (ulong)((uint)local_1b80 & 1);
        uVar75 = 0;
        local_1b80 = local_1b80 + 1;
        do {
          local_1988.d[3] = 0;
          local_1988.d[1] = 0;
          local_1988.d[2] = 0;
          local_1988.d[0] = local_1b78;
          secp256k1_scalar_cond_negate(&local_1988,(int)local_1b70);
          local_1b68 = uVar75 + 1;
          local_19c0.d[0] = local_1b68 >> 1;
          local_19c0.d[1] = 0;
          local_19c0.d[2] = 0;
          local_19c0.d[3] = 0;
          secp256k1_scalar_cond_negate(&local_19c0,(uint)uVar75 & 1);
          local_1ac8.x.n[2] = (uint64_t)local_1268;
          local_1ac8.x.n[0] = (uint64_t)local_13a8;
          local_1ac8.x.n[1] = (uint64_t)local_e58;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1ac8,&local_18e8,1,&local_1a48,&local_1988,
                     &secp256k1_scalar_zero);
          local_1968.x.n[0] = (uint64_t)local_13a8;
          local_1968.x.n[1] = (uint64_t)local_e58;
          local_1968.x.n[2] = (uint64_t)local_1268;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1968,&local_1ac8,1,&local_1a48,&local_19c0,
                     &secp256k1_scalar_zero);
          local_1b60 = 0;
          do {
            local_1b58 = local_1b60 + 1 >> 1;
            local_1b50 = (ulong)((uint)local_1b60 & 1);
            uVar75 = 0;
            local_1b60 = local_1b60 + 1;
            do {
              secp256k1_ge_set_gej(&local_b38,&local_18e8);
              secp256k1_ge_set_gej(local_ae0,&local_1ac8);
              local_1848.d[0] = local_1b58;
              local_1848.d[3] = 0;
              local_1848.d[1] = 0;
              local_1848.d[2] = 0;
              secp256k1_scalar_cond_negate(&local_1848,(int)local_1b50);
              local_1b88 = uVar75 + 1;
              local_1828.d[0] = local_1b88 >> 1;
              local_1828.d[1] = 0;
              local_1828.d[2] = 0;
              local_1828.d[3] = 0;
              secp256k1_scalar_cond_negate(&local_1828,(uint)uVar75 & 1);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_1988.d[0];
              auVar34._8_8_ = 0;
              auVar34._0_8_ = local_1848.d[0];
              uVar79 = SUB168(auVar2 * auVar34,8);
              auVar67._8_8_ = 0;
              auVar67._0_8_ = uVar79;
              local_1268._0_8_ = SUB168(auVar2 * auVar34,0);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_1988.d[0];
              auVar35._8_8_ = 0;
              auVar35._0_8_ = local_1848.d[1];
              auVar3 = auVar3 * auVar35;
              uVar91 = SUB168(auVar3 + auVar67,0);
              uVar96 = SUB168(auVar3 + auVar67,8);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = local_1988.d[1];
              auVar36._8_8_ = 0;
              auVar36._0_8_ = local_1848.d[0];
              uVar80 = SUB168(auVar4 * auVar36,8);
              uVar75 = SUB168(auVar4 * auVar36,0);
              local_1268._8_8_ = uVar91 + uVar75;
              uVar75 = (ulong)CARRY8(uVar91,uVar75);
              uVar91 = uVar96 + uVar80;
              uVar97 = uVar91 + uVar75;
              uVar98 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar79,auVar3._0_8_)) +
                       (ulong)(CARRY8(uVar96,uVar80) || CARRY8(uVar91,uVar75));
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_1988.d[0];
              auVar37._8_8_ = 0;
              auVar37._0_8_ = local_1848.d[2];
              uVar81 = SUB168(auVar5 * auVar37,8);
              uVar75 = SUB168(auVar5 * auVar37,0);
              uVar79 = uVar97 + uVar75;
              uVar75 = (ulong)CARRY8(uVar97,uVar75);
              uVar80 = uVar98 + uVar81;
              uVar99 = uVar80 + uVar75;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = local_1988.d[1];
              auVar38._8_8_ = 0;
              auVar38._0_8_ = local_1848.d[1];
              uVar82 = SUB168(auVar6 * auVar38,8);
              uVar91 = SUB168(auVar6 * auVar38,0);
              uVar97 = uVar79 + uVar91;
              uVar91 = (ulong)CARRY8(uVar79,uVar91);
              uVar96 = uVar99 + uVar82;
              uVar100 = uVar96 + uVar91;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_1988.d[2];
              auVar39._8_8_ = 0;
              auVar39._0_8_ = local_1848.d[0];
              uVar83 = SUB168(auVar7 * auVar39,8);
              uVar79 = SUB168(auVar7 * auVar39,0);
              local_1268._16_8_ = uVar97 + uVar79;
              uVar79 = (ulong)CARRY8(uVar97,uVar79);
              uVar97 = uVar100 + uVar83;
              uVar101 = uVar97 + uVar79;
              uVar92 = (ulong)(CARRY8(uVar98,uVar81) || CARRY8(uVar80,uVar75)) +
                       (ulong)(CARRY8(uVar99,uVar82) || CARRY8(uVar96,uVar91)) +
                       (ulong)(CARRY8(uVar100,uVar83) || CARRY8(uVar97,uVar79));
              auVar8._8_8_ = 0;
              auVar8._0_8_ = local_1988.d[0];
              auVar40._8_8_ = 0;
              auVar40._0_8_ = local_1848.d[3];
              uVar83 = SUB168(auVar8 * auVar40,8);
              uVar75 = SUB168(auVar8 * auVar40,0);
              uVar79 = uVar101 + uVar75;
              uVar75 = (ulong)CARRY8(uVar101,uVar75);
              uVar96 = uVar92 + uVar83;
              uVar101 = uVar96 + uVar75;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = local_1988.d[1];
              auVar41._8_8_ = 0;
              auVar41._0_8_ = local_1848.d[2];
              uVar98 = SUB168(auVar9 * auVar41,8);
              uVar91 = SUB168(auVar9 * auVar41,0);
              uVar80 = uVar79 + uVar91;
              uVar91 = (ulong)CARRY8(uVar79,uVar91);
              uVar97 = uVar101 + uVar98;
              uVar93 = uVar97 + uVar91;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = local_1988.d[2];
              auVar42._8_8_ = 0;
              auVar42._0_8_ = local_1848.d[1];
              uVar99 = SUB168(auVar10 * auVar42,8);
              uVar79 = SUB168(auVar10 * auVar42,0);
              uVar82 = uVar80 + uVar79;
              uVar79 = (ulong)CARRY8(uVar80,uVar79);
              uVar81 = uVar93 + uVar99;
              uVar94 = uVar81 + uVar79;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = local_1988.d[3];
              auVar43._8_8_ = 0;
              auVar43._0_8_ = local_1848.d[0];
              uVar100 = SUB168(auVar11 * auVar43,8);
              uVar80 = SUB168(auVar11 * auVar43,0);
              local_1268._24_8_ = uVar82 + uVar80;
              uVar80 = (ulong)CARRY8(uVar82,uVar80);
              uVar82 = uVar94 + uVar100;
              uVar95 = uVar82 + uVar80;
              uVar98 = (ulong)(CARRY8(uVar92,uVar83) || CARRY8(uVar96,uVar75)) +
                       (ulong)(CARRY8(uVar101,uVar98) || CARRY8(uVar97,uVar91)) +
                       (ulong)(CARRY8(uVar93,uVar99) || CARRY8(uVar81,uVar79)) +
                       (ulong)(CARRY8(uVar94,uVar100) || CARRY8(uVar82,uVar80));
              auVar12._8_8_ = 0;
              auVar12._0_8_ = local_1988.d[1];
              auVar44._8_8_ = 0;
              auVar44._0_8_ = local_1848.d[3];
              uVar81 = SUB168(auVar12 * auVar44,8);
              uVar75 = SUB168(auVar12 * auVar44,0);
              uVar79 = uVar95 + uVar75;
              uVar75 = (ulong)CARRY8(uVar95,uVar75);
              uVar80 = uVar98 + uVar81;
              uVar99 = uVar80 + uVar75;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = local_1988.d[2];
              auVar45._8_8_ = 0;
              auVar45._0_8_ = local_1848.d[2];
              uVar82 = SUB168(auVar13 * auVar45,8);
              uVar91 = SUB168(auVar13 * auVar45,0);
              uVar97 = uVar79 + uVar91;
              uVar91 = (ulong)CARRY8(uVar79,uVar91);
              uVar96 = uVar99 + uVar82;
              uVar100 = uVar96 + uVar91;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = local_1988.d[3];
              auVar46._8_8_ = 0;
              auVar46._0_8_ = local_1848.d[1];
              uVar83 = SUB168(auVar14 * auVar46,8);
              uVar79 = SUB168(auVar14 * auVar46,0);
              local_1268._32_8_ = uVar97 + uVar79;
              uVar79 = (ulong)CARRY8(uVar97,uVar79);
              uVar97 = uVar100 + uVar83;
              uVar92 = uVar97 + uVar79;
              uVar81 = (ulong)(CARRY8(uVar98,uVar81) || CARRY8(uVar80,uVar75)) +
                       (ulong)(CARRY8(uVar99,uVar82) || CARRY8(uVar96,uVar91)) +
                       (ulong)(CARRY8(uVar100,uVar83) || CARRY8(uVar97,uVar79));
              auVar15._8_8_ = 0;
              auVar15._0_8_ = local_1988.d[2];
              auVar47._8_8_ = 0;
              auVar47._0_8_ = local_1848.d[3];
              uVar96 = SUB168(auVar15 * auVar47,8);
              uVar75 = SUB168(auVar15 * auVar47,0);
              uVar80 = uVar92 + uVar75;
              uVar75 = (ulong)CARRY8(uVar92,uVar75);
              uVar79 = uVar81 + uVar96;
              uVar82 = uVar79 + uVar75;
              auVar16._8_8_ = 0;
              auVar16._0_8_ = local_1988.d[3];
              auVar48._8_8_ = 0;
              auVar48._0_8_ = local_1848.d[2];
              uVar97 = SUB168(auVar16 * auVar48,8);
              uVar91 = SUB168(auVar16 * auVar48,0);
              local_1268._40_8_ = uVar80 + uVar91;
              uVar91 = (ulong)CARRY8(uVar80,uVar91);
              uVar80 = uVar82 + uVar97;
              local_1268._56_8_ =
                   (ulong)(CARRY8(uVar81,uVar96) || CARRY8(uVar79,uVar75)) +
                   (ulong)(CARRY8(uVar82,uVar97) || CARRY8(uVar80,uVar91));
              local_1268._48_8_ = uVar80 + uVar91;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_1988.d[3];
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_1848.d[3];
              local_1268._48_16_ = auVar17 * auVar49 + local_1268._48_16_;
              secp256k1_scalar_reduce_512(&local_1868,(uint64_t *)local_1268);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_19c0.d[0];
              auVar50._8_8_ = 0;
              auVar50._0_8_ = local_1828.d[0];
              uVar79 = SUB168(auVar18 * auVar50,8);
              auVar68._8_8_ = 0;
              auVar68._0_8_ = uVar79;
              local_1268._0_8_ = SUB168(auVar18 * auVar50,0);
              auVar19._8_8_ = 0;
              auVar19._0_8_ = local_19c0.d[0];
              auVar51._8_8_ = 0;
              auVar51._0_8_ = local_1828.d[1];
              auVar19 = auVar19 * auVar51;
              uVar91 = SUB168(auVar19 + auVar68,0);
              uVar96 = SUB168(auVar19 + auVar68,8);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = local_19c0.d[1];
              auVar52._8_8_ = 0;
              auVar52._0_8_ = local_1828.d[0];
              uVar80 = SUB168(auVar20 * auVar52,8);
              uVar75 = SUB168(auVar20 * auVar52,0);
              local_1268._8_8_ = uVar91 + uVar75;
              uVar75 = (ulong)CARRY8(uVar91,uVar75);
              uVar91 = uVar96 + uVar80;
              uVar97 = uVar91 + uVar75;
              uVar98 = (ulong)CARRY8(auVar19._8_8_,(ulong)CARRY8(uVar79,auVar19._0_8_)) +
                       (ulong)(CARRY8(uVar96,uVar80) || CARRY8(uVar91,uVar75));
              auVar21._8_8_ = 0;
              auVar21._0_8_ = local_19c0.d[0];
              auVar53._8_8_ = 0;
              auVar53._0_8_ = local_1828.d[2];
              uVar81 = SUB168(auVar21 * auVar53,8);
              uVar75 = SUB168(auVar21 * auVar53,0);
              uVar79 = uVar97 + uVar75;
              uVar75 = (ulong)CARRY8(uVar97,uVar75);
              uVar80 = uVar98 + uVar81;
              uVar99 = uVar80 + uVar75;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = local_19c0.d[1];
              auVar54._8_8_ = 0;
              auVar54._0_8_ = local_1828.d[1];
              uVar82 = SUB168(auVar22 * auVar54,8);
              uVar91 = SUB168(auVar22 * auVar54,0);
              uVar97 = uVar79 + uVar91;
              uVar91 = (ulong)CARRY8(uVar79,uVar91);
              uVar96 = uVar99 + uVar82;
              uVar100 = uVar96 + uVar91;
              auVar23._8_8_ = 0;
              auVar23._0_8_ = local_19c0.d[2];
              auVar55._8_8_ = 0;
              auVar55._0_8_ = local_1828.d[0];
              uVar83 = SUB168(auVar23 * auVar55,8);
              uVar79 = SUB168(auVar23 * auVar55,0);
              local_1268._16_8_ = uVar97 + uVar79;
              uVar79 = (ulong)CARRY8(uVar97,uVar79);
              uVar97 = uVar100 + uVar83;
              uVar101 = uVar97 + uVar79;
              uVar92 = (ulong)(CARRY8(uVar98,uVar81) || CARRY8(uVar80,uVar75)) +
                       (ulong)(CARRY8(uVar99,uVar82) || CARRY8(uVar96,uVar91)) +
                       (ulong)(CARRY8(uVar100,uVar83) || CARRY8(uVar97,uVar79));
              auVar24._8_8_ = 0;
              auVar24._0_8_ = local_19c0.d[0];
              auVar56._8_8_ = 0;
              auVar56._0_8_ = local_1828.d[3];
              uVar83 = SUB168(auVar24 * auVar56,8);
              uVar75 = SUB168(auVar24 * auVar56,0);
              uVar79 = uVar101 + uVar75;
              uVar75 = (ulong)CARRY8(uVar101,uVar75);
              uVar96 = uVar92 + uVar83;
              uVar101 = uVar96 + uVar75;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = local_19c0.d[1];
              auVar57._8_8_ = 0;
              auVar57._0_8_ = local_1828.d[2];
              uVar98 = SUB168(auVar25 * auVar57,8);
              uVar91 = SUB168(auVar25 * auVar57,0);
              uVar80 = uVar79 + uVar91;
              uVar91 = (ulong)CARRY8(uVar79,uVar91);
              uVar97 = uVar101 + uVar98;
              uVar93 = uVar97 + uVar91;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = local_19c0.d[2];
              auVar58._8_8_ = 0;
              auVar58._0_8_ = local_1828.d[1];
              uVar99 = SUB168(auVar26 * auVar58,8);
              uVar79 = SUB168(auVar26 * auVar58,0);
              uVar82 = uVar80 + uVar79;
              uVar79 = (ulong)CARRY8(uVar80,uVar79);
              uVar81 = uVar93 + uVar99;
              uVar94 = uVar81 + uVar79;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = local_19c0.d[3];
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_1828.d[0];
              uVar100 = SUB168(auVar27 * auVar59,8);
              uVar80 = SUB168(auVar27 * auVar59,0);
              local_1268._24_8_ = uVar82 + uVar80;
              uVar80 = (ulong)CARRY8(uVar82,uVar80);
              uVar82 = uVar94 + uVar100;
              uVar95 = uVar82 + uVar80;
              uVar98 = (ulong)(CARRY8(uVar92,uVar83) || CARRY8(uVar96,uVar75)) +
                       (ulong)(CARRY8(uVar101,uVar98) || CARRY8(uVar97,uVar91)) +
                       (ulong)(CARRY8(uVar93,uVar99) || CARRY8(uVar81,uVar79)) +
                       (ulong)(CARRY8(uVar94,uVar100) || CARRY8(uVar82,uVar80));
              auVar28._8_8_ = 0;
              auVar28._0_8_ = local_19c0.d[1];
              auVar60._8_8_ = 0;
              auVar60._0_8_ = local_1828.d[3];
              uVar81 = SUB168(auVar28 * auVar60,8);
              uVar75 = SUB168(auVar28 * auVar60,0);
              uVar79 = uVar95 + uVar75;
              uVar75 = (ulong)CARRY8(uVar95,uVar75);
              uVar80 = uVar98 + uVar81;
              uVar99 = uVar80 + uVar75;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = local_19c0.d[2];
              auVar61._8_8_ = 0;
              auVar61._0_8_ = local_1828.d[2];
              uVar82 = SUB168(auVar29 * auVar61,8);
              uVar91 = SUB168(auVar29 * auVar61,0);
              uVar97 = uVar79 + uVar91;
              uVar91 = (ulong)CARRY8(uVar79,uVar91);
              uVar96 = uVar99 + uVar82;
              uVar100 = uVar96 + uVar91;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = local_19c0.d[3];
              auVar62._8_8_ = 0;
              auVar62._0_8_ = local_1828.d[1];
              uVar83 = SUB168(auVar30 * auVar62,8);
              uVar79 = SUB168(auVar30 * auVar62,0);
              local_1268._32_8_ = uVar97 + uVar79;
              uVar79 = (ulong)CARRY8(uVar97,uVar79);
              uVar97 = uVar100 + uVar83;
              uVar92 = uVar97 + uVar79;
              uVar81 = (ulong)(CARRY8(uVar98,uVar81) || CARRY8(uVar80,uVar75)) +
                       (ulong)(CARRY8(uVar99,uVar82) || CARRY8(uVar96,uVar91)) +
                       (ulong)(CARRY8(uVar100,uVar83) || CARRY8(uVar97,uVar79));
              auVar31._8_8_ = 0;
              auVar31._0_8_ = local_19c0.d[2];
              auVar63._8_8_ = 0;
              auVar63._0_8_ = local_1828.d[3];
              uVar96 = SUB168(auVar31 * auVar63,8);
              uVar75 = SUB168(auVar31 * auVar63,0);
              uVar80 = uVar92 + uVar75;
              uVar75 = (ulong)CARRY8(uVar92,uVar75);
              uVar79 = uVar81 + uVar96;
              uVar82 = uVar79 + uVar75;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_19c0.d[3];
              auVar64._8_8_ = 0;
              auVar64._0_8_ = local_1828.d[2];
              uVar97 = SUB168(auVar32 * auVar64,8);
              uVar91 = SUB168(auVar32 * auVar64,0);
              local_1268._40_8_ = uVar80 + uVar91;
              uVar91 = (ulong)CARRY8(uVar80,uVar91);
              uVar80 = uVar82 + uVar97;
              auVar66._8_8_ =
                   (ulong)(CARRY8(uVar81,uVar96) || CARRY8(uVar79,uVar75)) +
                   (ulong)(CARRY8(uVar82,uVar97) || CARRY8(uVar80,uVar91));
              auVar66._0_8_ = uVar80 + uVar91;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = local_19c0.d[3];
              auVar65._8_8_ = 0;
              auVar65._0_8_ = local_1828.d[3];
              local_1268._48_16_ = auVar33 * auVar65 + auVar66;
              r_01 = (secp256k1_strauss_point_state *)local_1268;
              secp256k1_scalar_reduce_512(&local_1448,(uint64_t *)r_01);
              secp256k1_scalar_add(&local_1868,&local_1868,&local_1448);
              local_19a0.aux = local_13a8;
              local_19a0.pre_a = (secp256k1_ge *)local_e58;
              local_19a0.ps = r_01;
              secp256k1_ecmult_strauss_wnaf
                        (&local_19a0,&local_1968,1,&local_1a48,&local_1868,&secp256k1_scalar_zero);
              error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar77 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              cbdata = &local_1b98;
              psVar86 = (secp256k1_strauss_point_state *)scratch;
              iVar72 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,local_e58,
                                       &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,2);
              if (iVar72 == 0) {
                test_ecmult_multi_cold_3();
LAB_00167251:
                test_ecmult_multi_cold_2();
                goto LAB_00167256;
              }
              secp256k1_gej_neg((secp256k1_gej *)r_01,local_e58);
              psVar77 = (secp256k1_scalar *)0x0;
              error_callback = r_01;
              secp256k1_gej_add_var
                        ((secp256k1_gej *)r_01,(secp256k1_gej *)r_01,&local_1968,(secp256k1_fe *)0x0
                        );
              psVar86 = r_01;
              if (local_11f0 == 0) goto LAB_00167251;
              uVar75 = local_1b88;
            } while (local_1b88 != 8);
          } while (local_1b60 != 8);
          uVar75 = local_1b68;
        } while (local_1b68 != 8);
        if (local_1b80 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_001672dd;
  }
  goto LAB_001672d8;
LAB_00167256:
  test_ecmult_multi_cold_21();
LAB_0016725b:
  test_ecmult_multi_cold_20();
LAB_00167260:
  test_ecmult_multi_cold_19();
LAB_00167265:
  test_ecmult_multi_cold_18();
LAB_0016726a:
  test_ecmult_multi_cold_17();
LAB_0016726f:
  test_ecmult_multi_cold_16();
LAB_00167274:
  test_ecmult_multi_cold_15();
LAB_00167279:
  test_ecmult_multi_cold_14();
LAB_0016727e:
  test_ecmult_multi_cold_29();
LAB_00167283:
  test_ecmult_multi_cold_28();
LAB_00167288:
  test_ecmult_multi_cold_27();
LAB_0016728d:
  test_ecmult_multi_cold_26();
LAB_00167292:
  test_ecmult_multi_cold_1();
LAB_00167297:
  test_ecmult_multi_cold_25();
LAB_0016729c:
  test_ecmult_multi_cold_24();
LAB_001672a1:
  test_ecmult_multi_cold_23();
LAB_001672a6:
  test_ecmult_multi_cold_22();
LAB_001672ab:
  test_ecmult_multi_cold_11();
LAB_001672b0:
  test_ecmult_multi_cold_10();
LAB_001672b5:
  test_ecmult_multi_cold_9();
LAB_001672ba:
  test_ecmult_multi_cold_8();
LAB_001672bf:
  test_ecmult_multi_cold_13();
LAB_001672c4:
  test_ecmult_multi_cold_12();
LAB_001672c9:
  test_ecmult_multi_cold_30();
LAB_001672ce:
  test_ecmult_multi_cold_7();
LAB_001672d3:
  test_ecmult_multi_cold_6();
LAB_001672d8:
  test_ecmult_multi_cold_5();
LAB_001672dd:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)error_callback,(secp256k1_scratch *)psVar86,r_00,psVar77,cb,
             cbdata,sStack_1bb0,0);
  return;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        random_scalar_order(&sc[0]);
        random_scalar_order(&sc[1]);

        random_group_element_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                random_group_element_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            random_group_element_test(&ptg);
            for (i = 0; i < 16; i++) {
                random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                random_group_element_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        random_group_element_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            random_group_element_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        random_group_element_test(&ptg);
        for (i = 0; i < 20; i++) {
            random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        random_scalar_order(&sc[ncount]);
        random_group_element_test(&pt[ncount]);
    }

    secp256k1_scalar_clear(&sc[0]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_clear(&sc[1]);
    secp256k1_scalar_clear(&sc[2]);
    secp256k1_scalar_clear(&sc[3]);
    secp256k1_scalar_clear(&sc[4]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        random_group_element_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}